

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O0

bool __thiscall MultForm::findResLo(MultForm *this)

{
  PcodeOp *pPVar1;
  bool bVar2;
  int4 iVar3;
  int4 iVar4;
  OpCode OVar5;
  reference ppPVar6;
  Varnode *pVVar7;
  Varnode *this_00;
  uintb uVar8;
  uintb uVar9;
  Varnode *vn2;
  Varnode *vn1;
  PcodeOp *op_1;
  PcodeOp *op;
  _List_const_iterator<PcodeOp_*> local_28;
  const_iterator enditer;
  const_iterator iter;
  MultForm *this_local;
  
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&enditer);
  std::_List_const_iterator<PcodeOp_*>::_List_const_iterator(&local_28);
  enditer = Varnode::beginDescend(this->midtmp);
  local_28._M_node = (_List_node_base *)Varnode::endDescend(this->midtmp);
  while (bVar2 = std::operator!=(&enditer,&local_28), bVar2) {
    ppPVar6 = std::_List_const_iterator<PcodeOp_*>::operator*(&enditer);
    pPVar1 = *ppPVar6;
    std::_List_const_iterator<PcodeOp_*>::operator++(&enditer);
    OVar5 = PcodeOp::code(pPVar1);
    if (OVar5 == CPUI_SUBPIECE) {
      pVVar7 = PcodeOp::getIn(pPVar1,1);
      uVar8 = Varnode::getOffset(pVVar7);
      if (uVar8 == 0) {
        pVVar7 = PcodeOp::getOut(pPVar1);
        this->reslo = pVVar7;
        iVar3 = Varnode::getSize(this->reslo);
        iVar4 = Varnode::getSize(this->lo1);
        if (iVar3 == iVar4) {
          return true;
        }
      }
    }
  }
  enditer = Varnode::beginDescend(this->lo1);
  local_28._M_node = (_List_node_base *)Varnode::endDescend(this->lo1);
  do {
    do {
      while( true ) {
        do {
          bVar2 = std::operator!=(&enditer,&local_28);
          if (!bVar2) {
            return false;
          }
          ppPVar6 = std::_List_const_iterator<PcodeOp_*>::operator*(&enditer);
          pPVar1 = *ppPVar6;
          std::_List_const_iterator<PcodeOp_*>::operator++(&enditer);
          OVar5 = PcodeOp::code(pPVar1);
        } while (OVar5 != CPUI_INT_MULT);
        pVVar7 = PcodeOp::getIn(pPVar1,0);
        this_00 = PcodeOp::getIn(pPVar1,1);
        bVar2 = Varnode::isConstant(this->lo2);
        if (bVar2) break;
        pVVar7 = PcodeOp::getIn(pPVar1,0);
        if ((pVVar7 == this->lo2) || (pVVar7 = PcodeOp::getIn(pPVar1,1), pVVar7 == this->lo2))
        goto LAB_00653b55;
      }
      bVar2 = Varnode::isConstant(pVVar7);
      if (bVar2) {
        uVar8 = Varnode::getOffset(pVVar7);
        uVar9 = Varnode::getOffset(this->lo2);
        if (uVar8 == uVar9) goto LAB_00653b55;
      }
      bVar2 = Varnode::isConstant(this_00);
    } while (!bVar2);
    uVar8 = Varnode::getOffset(this_00);
    uVar9 = Varnode::getOffset(this->lo2);
  } while (uVar8 != uVar9);
LAB_00653b55:
  pVVar7 = PcodeOp::getOut(pPVar1);
  this->reslo = pVVar7;
  return true;
}

Assistant:

bool MultForm::findResLo(void)

{ // Assuming we found -midtmp-, find potential reslo
  list<PcodeOp *>::const_iterator iter,enditer;
  iter = midtmp->beginDescend();
  enditer = midtmp->endDescend();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;
    if (op->code() != CPUI_SUBPIECE) continue;
    if (op->getIn(1)->getOffset() != 0) continue; // Must grab low bytes
    reslo = op->getOut();
    if (reslo->getSize() != lo1->getSize()) continue;
    return true;
  }
  // If we reach here, it may be that separate multiplies of lo1*lo2 were used for reshi and reslo
  iter = lo1->beginDescend();
  enditer = lo1->endDescend();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;
    if (op->code() != CPUI_INT_MULT) continue;
    Varnode *vn1 = op->getIn(0);
    Varnode *vn2 = op->getIn(1);
    if (lo2->isConstant()) {
      if ((!vn1->isConstant() || (vn1->getOffset() != lo2->getOffset())) &&
	  (!vn2->isConstant() || (vn2->getOffset() != lo2->getOffset())))
	continue;
    }
    else 
      if ((op->getIn(0)!=lo2)&&(op->getIn(1)!=lo2)) continue;
    reslo = op->getOut();
    return true;
  }
  return false;
}